

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O2

iterator __thiscall Tree<NULLC::Range>::find(Tree<NULLC::Range> *this,Range *key)

{
  iterator pnVar1;
  void *pvVar2;
  node<NULLC::Range> **ppnVar3;
  
  ppnVar3 = &this->root;
  while( true ) {
    pnVar1 = *ppnVar3;
    if ((pnVar1 == (iterator)0x0) ||
       ((pvVar2 = (pnVar1->key).start, pvVar2 <= key->end && (key->start <= (pnVar1->key).end))))
    break;
    ppnVar3 = &pnVar1->left + (pvVar2 <= key->end);
  }
  return pnVar1;
}

Assistant:

iterator find(const T& key)
	{
		node_type *curr = root;

		while(curr)
		{
			if(curr->key == key)
				return iterator(curr);

			curr = key < curr->key ? curr->left : curr->right;
		}

		return iterator(NULL);
	}